

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

void mp_zero(mp_int *a)

{
  a->sign = 0;
  a->used = 0;
  if (0 < (long)a->alloc) {
    memset(a->dp,0,(long)a->alloc << 3);
    return;
  }
  return;
}

Assistant:

void mp_zero (mp_int * a)
{
  int       n;
  mp_digit *tmp;

  a->sign = MP_ZPOS;
  a->used = 0;

  tmp = a->dp;
  for (n = 0; n < a->alloc; n++) {
     *tmp++ = 0;
  }
}